

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_daemon.c
# Opt level: O1

int daemon_init(char *pidfile)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  FILE *pFVar4;
  int *piVar5;
  uint uVar6;
  char *pcVar7;
  int pid;
  uint local_30;
  uint local_2c;
  
  local_2c = 0;
  pFVar4 = fopen(pidfile,"r");
  if (pFVar4 == (FILE *)0x0) {
    uVar6 = 0;
  }
  else {
    iVar2 = __isoc99_fscanf(pFVar4,"%d",&local_2c);
    fclose(pFVar4);
    uVar1 = local_2c;
    uVar6 = 0;
    if ((local_2c != 0 && iVar2 == 1) && (uVar3 = getpid(), uVar6 = 0, uVar1 != uVar3)) {
      iVar2 = kill(local_2c,0);
      if ((iVar2 == 0) || (piVar5 = __errno_location(), uVar6 = 0, *piVar5 != 3)) {
        uVar6 = local_2c;
      }
    }
  }
  if (uVar6 == 0) {
    iVar2 = daemon(1,0);
    if (iVar2 != 0) {
      daemon_init_cold_1();
      return 1;
    }
    local_30 = 0;
    iVar2 = open(pidfile,0x42,0x1a4);
    if (iVar2 == -1) {
      pcVar7 = "Can\'t create %s.\n";
    }
    else {
      pFVar4 = fdopen(iVar2,"r+");
      if (pFVar4 != (FILE *)0x0) {
        iVar2 = flock(iVar2,6);
        if (iVar2 != -1) {
          local_30 = getpid();
          iVar2 = fprintf(pFVar4,"%d\n",(ulong)local_30);
          if (iVar2 == 0) {
            daemon_init_cold_2();
            return 1;
          }
          fflush(pFVar4);
          return (uint)(local_30 == 0);
        }
        iVar2 = __isoc99_fscanf(pFVar4,"%d",&local_30);
        fclose(pFVar4);
        if (iVar2 != 1) {
          daemon_init_cold_3();
          return 1;
        }
        pcVar7 = "Can\'t lock pidfile, lock is held by pid %d.\n";
        uVar6 = local_30;
        goto LAB_00113e7e;
      }
      pcVar7 = "Can\'t open %s.\n";
    }
    fprintf(_stderr,pcVar7,pidfile);
  }
  else {
    pcVar7 = "Skynet is already running, pid = %d.\n";
LAB_00113e7e:
    fprintf(_stderr,pcVar7,(ulong)uVar6);
  }
  return 1;
}

Assistant:

int
daemon_init(const char *pidfile) {
	int pid = check_pid(pidfile);

	if (pid) {
		fprintf(stderr, "Skynet is already running, pid = %d.\n", pid);
		return 1;
	}

#ifdef __APPLE__
	fprintf(stderr, "'daemon' is deprecated: first deprecated in OS X 10.5 , use launchd instead.\n");
#else
	if (daemon(1,0)) {
		fprintf(stderr, "Can't daemonize.\n");
		return 1;
	}
#endif

	pid = write_pid(pidfile);
	if (pid == 0) {
		return 1;
	}

	return 0;
}